

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

double lf::assemble::test::test_vec_lr_mult(Mesh *mesh,DofHandler *dof_handler)

{
  Index *this;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  ostream *poVar3;
  Index IVar4;
  char *message;
  Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar5;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  double s2;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>
  local_1c8;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_1b8;
  Scalar local_1a0;
  double s1_alt;
  RhsNested local_190;
  ReturnType local_188;
  double s1;
  SparseMatrix<double,_0,_int> A;
  undefined1 local_118 [8];
  COOMatrix<double> mat;
  undefined1 local_e8 [8];
  MVMultAssembler assembler;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40 [16];
  undefined1 local_30 [8];
  VectorXd vec;
  size_type N_dofs;
  DofHandler *dof_handler_local;
  Mesh *mesh_local;
  
  vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (*dof_handler->_vptr_DofHandler[2])();
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows._4_4_);
  poVar3 = std::operator<<(poVar3," degrees of freedom");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)local_40,
             (ulong)vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._4_4_);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,local_40);
  MVMultAssembler::MVMultAssembler((MVMultAssembler *)local_e8,mesh);
  COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)local_118,
             vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
             _4_4_,vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows._4_4_);
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::assemble::test::MVMultAssembler>
            ((COOMatrix<double> *)&A.m_data.m_allocatedSize,0,dof_handler,
             (MVMultAssembler *)local_e8);
  this = &A.m_data.m_allocatedSize;
  COOMatrix<double>::operator=((COOMatrix<double> *)local_118,(COOMatrix<double> *)this);
  COOMatrix<double>::~COOMatrix((COOMatrix<double> *)this);
  poVar3 = std::operator<<((ostream *)&std::cout,"Assembled ");
  IVar4 = COOMatrix<double>::rows((COOMatrix<double> *)local_118);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar4);
  poVar3 = std::operator<<(poVar3,"x");
  IVar4 = COOMatrix<double>::cols((COOMatrix<double> *)local_118);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar4);
  poVar3 = std::operator<<(poVar3," matrix");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)&s1,(COOMatrix<double> *)local_118);
  PVar5 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator*
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)&s1,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  local_190 = PVar5.m_rhs;
  s1_alt = (double)PVar5.m_lhs;
  local_188 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              dot<Eigen::Product<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                        ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                         (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                          *)&s1_alt);
  s2 = (double)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  local_1c8 = Eigen::operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&s2,(SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&s1)
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::SparseMatrix<double,0,int>,0>>
  ::operator*(&local_1b8,
              (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::SparseMatrix<double,0,int>,0>>
               *)&local_1c8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  local_1a0 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_1b8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )multVecAssMat<double,lf::assemble::test::MVMultAssembler>
                   (0,dof_handler,(MVMultAssembler *)local_e8,
                    (Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e8,"s1","s2","1.0E-9",local_188,
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,1e-09);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,700,message);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  uVar1 = gtest_ar.message_;
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)&s1);
  COOMatrix<double>::~COOMatrix((COOMatrix<double> *)local_118);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return (double)(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )uVar1._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
}

Assistant:

double test_vec_lr_mult(const lf::mesh::Mesh &mesh,
                        const lf::assemble::DofHandler &dof_handler) {
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());
  std::cout << N_dofs << " degrees of freedom" << std::endl;
  // A random vector
  Eigen::VectorXd vec = Eigen::VectorXd::Random(N_dofs);

  // Dummy assembler
  MVMultAssembler assembler{mesh};
  lf::assemble::COOMatrix<double> mat(N_dofs, N_dofs);
  mat = lf::assemble::AssembleMatrixLocally<lf::assemble::COOMatrix<double>>(
      0, dof_handler, assembler);
  std::cout << "Assembled " << mat.rows() << "x" << mat.cols() << " matrix"
            << std::endl;
  // Build sparse matrix from COO format
  Eigen::SparseMatrix<double> A = mat.makeSparse();
  // Compute product of matrix with vector from left and right
  double s1 = vec.dot(A * vec);
  double s1_alt = vec.transpose() * A * vec;

  // Alternative way to comput product
  double s2 = multVecAssMat<double, decltype(assembler)>(0, dof_handler,
                                                         assembler, vec);

  EXPECT_NEAR(s1, s2, 1.0E-9);
  return s2;
}